

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3GetToken(uchar *z,int *tokenType)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uchar uVar6;
  long lVar7;
  int iVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uStack_20;
  
  bVar1 = *z;
  switch(bVar1) {
  case 0x20:
    goto switchD_00136f86_caseD_20;
  case 0x21:
    if (z[1] == '=') {
LAB_001373bd:
      *tokenType = 0x4e;
    }
    else {
      *tokenType = 0x96;
    }
    goto LAB_00137471;
  case 0x22:
  case 0x27:
  case 0x60:
    uStack_20 = 1;
    while( true ) {
      iVar3 = (int)uStack_20;
      lVar7 = (long)iVar3;
      if (z[lVar7] == 0) break;
      if (z[lVar7] == bVar1) {
        uStack_20 = lVar7 + 1;
        iVar3 = (int)uStack_20;
        if (z[lVar7 + 1] != bVar1) {
          if (bVar1 == 0x27) {
            *tokenType = 0x61;
          }
          else {
            *tokenType = 0x1b;
          }
          goto LAB_0013747f;
        }
      }
      uStack_20 = (ulong)(iVar3 + 1);
    }
    goto LAB_0013740a;
  case 0x23:
  case 0x24:
  case 0x3a:
  case 0x40:
    *tokenType = 0x87;
    iVar3 = 0;
    uStack_20 = 1;
    while( true ) {
      iVar8 = (int)uStack_20;
      bVar1 = z[iVar8];
      if ((ulong)bVar1 == 0) break;
      if ((""[bVar1] & 0x46) == 0) {
        if (0 < iVar3 && bVar1 == 0x28) {
          pbVar9 = z + iVar8;
          uStack_20 = (ulong)(iVar8 + 1);
          goto LAB_001373d3;
        }
        if ((bVar1 != 0x3a) || (z[(long)iVar8 + 1] != ':')) break;
        iVar8 = iVar8 + 1;
      }
      else {
        iVar3 = iVar3 + 1;
      }
      uStack_20 = (ulong)(iVar8 + 1);
    }
    goto LAB_00137406;
  case 0x25:
    *tokenType = 0x5d;
    break;
  case 0x26:
    *tokenType = 0x55;
    break;
  case 0x28:
    *tokenType = 0x16;
    break;
  case 0x29:
    *tokenType = 0x17;
    break;
  case 0x2a:
    *tokenType = 0x5b;
    break;
  case 0x2b:
    *tokenType = 0x59;
    break;
  case 0x2c:
    *tokenType = 0x1a;
    break;
  case 0x2d:
    if (z[1] != '-') {
      *tokenType = 0x5a;
      break;
    }
    for (uStack_20 = 2; (z[uStack_20] != '\0' && (z[uStack_20] != '\n')); uStack_20 = uStack_20 + 1)
    {
    }
    goto LAB_001370b6;
  case 0x2e:
    if (0xfffffffffffffff5 < (ulong)z[1] - 0x3a) goto switchD_00136f86_caseD_30;
    *tokenType = 0x7a;
    break;
  case 0x2f:
    if ((z[1] == '*') && (z[2] != '\0')) {
      uStack_20 = 4;
      uVar6 = z[2];
      for (uVar5 = 3; uVar2 = z[uVar5], uVar2 != '/' || uVar6 != '*'; uVar5 = uVar5 + 1) {
        if (uVar2 == '\0') {
          uStack_20 = uVar5 & 0xffffffff;
          break;
        }
        uStack_20 = (ulong)((int)uStack_20 + 1);
        uVar6 = uVar2;
      }
      goto LAB_001370b6;
    }
    *tokenType = 0x5c;
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
switchD_00136f86_caseD_30:
    *tokenType = 0x84;
    if (((*z == '0') && ((z[1] | 0x20) == 0x78)) && ((""[z[2]] & 8) != 0)) {
      lVar7 = 3;
      do {
        pbVar9 = z + lVar7;
        lVar7 = lVar7 + 1;
      } while ((""[*pbVar9] & 8) != 0);
      uStack_20 = (ulong)((int)lVar7 - 1);
    }
    else {
      lVar7 = -1;
      do {
        lVar4 = lVar7 + 1;
        lVar7 = lVar7 + 1;
      } while (0xfffffffffffffff5 < (ulong)z[lVar4] - 0x3a);
      if (z[lVar4] == 0x2e) {
        do {
          lVar4 = lVar7 + 1;
          lVar7 = lVar7 + 1;
        } while (0xfffffffffffffff5 < (ulong)z[lVar4] - 0x3a);
        *tokenType = 0x85;
      }
      uStack_20 = (ulong)(int)lVar7;
      if (((z[uStack_20] | 0x20) == 0x65) &&
         ((bVar1 = z[uStack_20 + 1], 0xfffffffffffffff5 < (ulong)bVar1 - 0x3a ||
          (((bVar1 == 0x2d || (bVar1 == 0x2b)) &&
           (0xfffffffffffffff5 < (ulong)z[uStack_20 + 2] - 0x3a)))))) {
        lVar4 = (lVar7 << 0x20) + 0x100000000;
        pbVar9 = z + ((lVar7 << 0x20) + 0x200000000 >> 0x20);
        do {
          bVar1 = *pbVar9;
          lVar4 = lVar4 + 0x100000000;
          pbVar9 = pbVar9 + 1;
        } while (0xfffffffffffffff5 < (ulong)bVar1 - 0x3a);
        *tokenType = 0x85;
        uStack_20 = lVar4 >> 0x20;
      }
      while ((""[z[uStack_20]] & 0x46) != 0) {
        *tokenType = 0x96;
        uStack_20 = uStack_20 + 1;
      }
    }
    goto LAB_0013747f;
  case 0x3b:
    *tokenType = 1;
    break;
  case 0x3c:
    uVar6 = z[1];
    if (uVar6 == '<') {
      *tokenType = 0x57;
    }
    else {
      if (uVar6 == '>') goto LAB_001373bd;
      if (uVar6 != '=') {
        *tokenType = 0x52;
        break;
      }
      *tokenType = 0x51;
    }
    goto LAB_00137471;
  case 0x3d:
    *tokenType = 0x4f;
    uStack_20 = (ulong)((z[1] == '=') + 1);
    goto LAB_0013747f;
  case 0x3e:
    if (z[1] == '>') {
      *tokenType = 0x58;
    }
    else {
      if (z[1] != '=') {
        *tokenType = 0x50;
        break;
      }
      *tokenType = 0x53;
    }
    goto LAB_00137471;
  case 0x3f:
    *tokenType = 0x87;
    uStack_20 = 0;
    do {
      lVar7 = uStack_20 + 1;
      uStack_20 = uStack_20 + 1;
    } while (0xfffffffffffffff5 < (ulong)z[lVar7] - 0x3a);
    goto LAB_0013747f;
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x59:
  case 0x5a:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7d:
    goto switchD_00136f86_caseD_41;
  case 0x58:
  case 0x78:
    if (z[1] == '\'') {
      *tokenType = 0x86;
      uVar5 = 1;
      do {
        lVar7 = uVar5 + 1;
        uVar5 = uVar5 + 1;
      } while ((""[z[lVar7]] & 8) != 0);
      if ((uVar5 & 1) != 0 || z[lVar7] != 0x27) {
        *tokenType = 0x96;
        for (; (z[uVar5] != '\0' && (z[uVar5] != '\'')); uVar5 = uVar5 + 1) {
        }
      }
      uStack_20 = (ulong)(((int)uVar5 + 1) - (uint)(z[(int)uVar5] == '\0'));
      goto LAB_0013747f;
    }
switchD_00136f86_caseD_41:
    if ((""[bVar1] & 0x46) != 0) {
      uStack_20 = 0;
      do {
        lVar7 = uStack_20 + 1;
        uStack_20 = uStack_20 + 1;
      } while ((""[z[lVar7]] & 0x46) != 0);
      iVar3 = keywordCode((char *)z,(int)uStack_20);
LAB_0013744f:
      *tokenType = iVar3;
      goto LAB_0013747f;
    }
    *tokenType = 0x96;
    break;
  case 0x5b:
    uVar6 = '[';
    uStack_20 = 1;
    iVar3 = 0x1b;
    while (uVar6 != ']') {
      uVar6 = z[uStack_20];
      if (uVar6 == '\0') {
        iVar3 = 0x96;
        break;
      }
      uStack_20 = uStack_20 + 1;
    }
    goto LAB_0013744f;
  case 0x7c:
    if (z[1] != '|') {
      *tokenType = 0x56;
      break;
    }
    *tokenType = 0x5e;
LAB_00137471:
    uStack_20 = 2;
    goto LAB_0013747f;
  case 0x7e:
    *tokenType = 0x60;
    break;
  default:
    if ((0xd < bVar1) || ((0x3600U >> (bVar1 & 0x1f) & 1) == 0)) goto switchD_00136f86_caseD_41;
    goto switchD_00136f86_caseD_20;
  }
  uStack_20 = 1;
LAB_0013747f:
  return (int)uStack_20;
  while ((uStack_20 = (ulong)((int)uVar10 + 1), uVar5 != 0x29 && ((""[uVar5] & 1) == 0))) {
LAB_001373d3:
    uVar10 = uStack_20;
    pbVar9 = pbVar9 + 1;
    uVar5 = (ulong)*pbVar9;
    if (uVar5 == 0) goto LAB_001373fd;
  }
  if (*pbVar9 != 0x29) {
LAB_001373fd:
    *tokenType = 0x96;
    uStack_20 = uVar10;
  }
LAB_00137406:
  if (iVar3 != 0) goto LAB_0013747f;
LAB_0013740a:
  *tokenType = 0x96;
  goto LAB_0013747f;
switchD_00136f86_caseD_20:
  uStack_20 = 0;
  do {
    lVar7 = uStack_20 + 1;
    uStack_20 = uStack_20 + 1;
  } while ((""[z[lVar7]] & 1) != 0);
LAB_001370b6:
  *tokenType = 0x97;
  goto LAB_0013747f;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetToken(const unsigned char *z, int *tokenType){
  int i, c;
  switch( *z ){
    case ' ': case '\t': case '\n': case '\f': case '\r': {
      testcase( z[0]==' ' );
      testcase( z[0]=='\t' );
      testcase( z[0]=='\n' );
      testcase( z[0]=='\f' );
      testcase( z[0]=='\r' );
      for(i=1; sqlite3Isspace(z[i]); i++){}
      *tokenType = TK_SPACE;
      return i;
    }
    case '-': {
      if( z[1]=='-' ){
        for(i=2; (c=z[i])!=0 && c!='\n'; i++){}
        *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
        return i;
      }
      *tokenType = TK_MINUS;
      return 1;
    }
    case '(': {
      *tokenType = TK_LP;
      return 1;
    }
    case ')': {
      *tokenType = TK_RP;
      return 1;
    }
    case ';': {
      *tokenType = TK_SEMI;
      return 1;
    }
    case '+': {
      *tokenType = TK_PLUS;
      return 1;
    }
    case '*': {
      *tokenType = TK_STAR;
      return 1;
    }
    case '/': {
      if( z[1]!='*' || z[2]==0 ){
        *tokenType = TK_SLASH;
        return 1;
      }
      for(i=3, c=z[2]; (c!='*' || z[i]!='/') && (c=z[i])!=0; i++){}
      if( c ) i++;
      *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
      return i;
    }
    case '%': {
      *tokenType = TK_REM;
      return 1;
    }
    case '=': {
      *tokenType = TK_EQ;
      return 1 + (z[1]=='=');
    }
    case '<': {
      if( (c=z[1])=='=' ){
        *tokenType = TK_LE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_NE;
        return 2;
      }else if( c=='<' ){
        *tokenType = TK_LSHIFT;
        return 2;
      }else{
        *tokenType = TK_LT;
        return 1;
      }
    }
    case '>': {
      if( (c=z[1])=='=' ){
        *tokenType = TK_GE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_RSHIFT;
        return 2;
      }else{
        *tokenType = TK_GT;
        return 1;
      }
    }
    case '!': {
      if( z[1]!='=' ){
        *tokenType = TK_ILLEGAL;
        return 2;
      }else{
        *tokenType = TK_NE;
        return 2;
      }
    }
    case '|': {
      if( z[1]!='|' ){
        *tokenType = TK_BITOR;
        return 1;
      }else{
        *tokenType = TK_CONCAT;
        return 2;
      }
    }
    case ',': {
      *tokenType = TK_COMMA;
      return 1;
    }
    case '&': {
      *tokenType = TK_BITAND;
      return 1;
    }
    case '~': {
      *tokenType = TK_BITNOT;
      return 1;
    }
    case '`':
    case '\'':
    case '"': {
      int delim = z[0];
      testcase( delim=='`' );
      testcase( delim=='\'' );
      testcase( delim=='"' );
      for(i=1; (c=z[i])!=0; i++){
        if( c==delim ){
          if( z[i+1]==delim ){
            i++;
          }else{
            break;
          }
        }
      }
      if( c=='\'' ){
        *tokenType = TK_STRING;
        return i+1;
      }else if( c!=0 ){
        *tokenType = TK_ID;
        return i+1;
      }else{
        *tokenType = TK_ILLEGAL;
        return i;
      }
    }
    case '.': {
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( !sqlite3Isdigit(z[1]) )
#endif
      {
        *tokenType = TK_DOT;
        return 1;
      }
      /* If the next character is a digit, this is a floating point
      ** number that begins with ".".  Fall thru into the next case */
    }
    case '0': case '1': case '2': case '3': case '4':
    case '5': case '6': case '7': case '8': case '9': {
      testcase( z[0]=='0' );  testcase( z[0]=='1' );  testcase( z[0]=='2' );
      testcase( z[0]=='3' );  testcase( z[0]=='4' );  testcase( z[0]=='5' );
      testcase( z[0]=='6' );  testcase( z[0]=='7' );  testcase( z[0]=='8' );
      testcase( z[0]=='9' );
      *tokenType = TK_INTEGER;
#ifndef SQLITE_OMIT_HEX_INTEGER
      if( z[0]=='0' && (z[1]=='x' || z[1]=='X') && sqlite3Isxdigit(z[2]) ){
        for(i=3; sqlite3Isxdigit(z[i]); i++){}
        return i;
      }
#endif
      for(i=0; sqlite3Isdigit(z[i]); i++){}
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( z[i]=='.' ){
        i++;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
      if( (z[i]=='e' || z[i]=='E') &&
           ( sqlite3Isdigit(z[i+1]) 
            || ((z[i+1]=='+' || z[i+1]=='-') && sqlite3Isdigit(z[i+2]))
           )
      ){
        i += 2;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
#endif
      while( IdChar(z[i]) ){
        *tokenType = TK_ILLEGAL;
        i++;
      }
      return i;
    }
    case '[': {
      for(i=1, c=z[0]; c!=']' && (c=z[i])!=0; i++){}
      *tokenType = c==']' ? TK_ID : TK_ILLEGAL;
      return i;
    }
    case '?': {
      *tokenType = TK_VARIABLE;
      for(i=1; sqlite3Isdigit(z[i]); i++){}
      return i;
    }
#ifndef SQLITE_OMIT_TCL_VARIABLE
    case '$':
#endif
    case '@':  /* For compatibility with MS SQL Server */
    case '#':
    case ':': {
      int n = 0;
      testcase( z[0]=='$' );  testcase( z[0]=='@' );
      testcase( z[0]==':' );  testcase( z[0]=='#' );
      *tokenType = TK_VARIABLE;
      for(i=1; (c=z[i])!=0; i++){
        if( IdChar(c) ){
          n++;
#ifndef SQLITE_OMIT_TCL_VARIABLE
        }else if( c=='(' && n>0 ){
          do{
            i++;
          }while( (c=z[i])!=0 && !sqlite3Isspace(c) && c!=')' );
          if( c==')' ){
            i++;
          }else{
            *tokenType = TK_ILLEGAL;
          }
          break;
        }else if( c==':' && z[i+1]==':' ){
          i++;
#endif
        }else{
          break;
        }
      }
      if( n==0 ) *tokenType = TK_ILLEGAL;
      return i;
    }
#ifndef SQLITE_OMIT_BLOB_LITERAL
    case 'x': case 'X': {
      testcase( z[0]=='x' ); testcase( z[0]=='X' );
      if( z[1]=='\'' ){
        *tokenType = TK_BLOB;
        for(i=2; sqlite3Isxdigit(z[i]); i++){}
        if( z[i]!='\'' || i%2 ){
          *tokenType = TK_ILLEGAL;
          while( z[i] && z[i]!='\'' ){ i++; }
        }
        if( z[i] ) i++;
        return i;
      }
      /* Otherwise fall through to the next case */
    }
#endif
    default: {
      if( !IdChar(*z) ){
        break;
      }
      for(i=1; IdChar(z[i]); i++){}
      *tokenType = keywordCode((char*)z, i);
      return i;
    }
  }
  *tokenType = TK_ILLEGAL;
  return 1;
}